

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::SearchAppBundlePrefix(cmFindPackageCommand *this,string *prefix_in)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  string_view sVar4;
  cmCaseInsensitiveDirectoryListGenerator local_128;
  undefined4 local_fc;
  string_view local_f8;
  string_view local_e8;
  undefined1 local_d0 [8];
  cmAppendPathSegmentGenerator crGen;
  undefined1 local_88 [8];
  cmMacProjectDirectoryListGenerator appGen;
  anon_class_8_1_8991fb9c searchFn;
  string prefix;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar3 = false;
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    bVar3 = *pcVar2 == '/';
  }
  if (!bVar3) {
    __assert_fail("!prefix_in.empty() && prefix_in.back() == \'/\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx"
                  ,0xa50,"bool cmFindPackageCommand::SearchAppBundlePrefix(const std::string &)");
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&searchFn,(ulong)prefix_in);
  appGen.Extension._M_str = (char *)this;
  sVar4 = (string_view)::cm::operator____s(".app",4);
  anon_unknown.dwarf_56d607::cmMacProjectDirectoryListGenerator::cmMacProjectDirectoryListGenerator
            ((cmMacProjectDirectoryListGenerator *)local_88,&this->Names,sVar4);
  local_f8 = (string_view)::cm::operator____s("Contents/Resources",0x12);
  local_e8 = local_f8;
  anon_unknown.dwarf_56d607::cmAppendPathSegmentGenerator::cmAppendPathSegmentGenerator
            ((cmAppendPathSegmentGenerator *)local_d0,local_f8);
  bVar3 = (anonymous_namespace)::
          TryGeneratedPaths<cmFindPackageCommand::SearchAppBundlePrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&>
                    ((anon_class_8_1_8991fb9c *)&appGen.Extension._M_str,(string *)&searchFn,
                     (cmMacProjectDirectoryListGenerator *)local_88,
                     (cmAppendPathSegmentGenerator *)local_d0);
  if (bVar3) {
    this_local._7_1_ = true;
  }
  else {
    sVar4 = (string_view)::cm::operator____s("cmake",5);
    anon_unknown.dwarf_56d607::cmCaseInsensitiveDirectoryListGenerator::
    cmCaseInsensitiveDirectoryListGenerator(&local_128,sVar4);
    this_local._7_1_ =
         (anonymous_namespace)::
         TryGeneratedPaths<cmFindPackageCommand::SearchAppBundlePrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator>
                   ((anon_class_8_1_8991fb9c *)&appGen.Extension._M_str,(string *)&searchFn,
                    (cmMacProjectDirectoryListGenerator *)local_88,
                    (cmAppendPathSegmentGenerator *)local_d0,&local_128);
    anon_unknown.dwarf_56d607::cmCaseInsensitiveDirectoryListGenerator::
    ~cmCaseInsensitiveDirectoryListGenerator(&local_128);
  }
  local_fc = 1;
  anon_unknown.dwarf_56d607::cmMacProjectDirectoryListGenerator::~cmMacProjectDirectoryListGenerator
            ((cmMacProjectDirectoryListGenerator *)local_88);
  std::__cxx11::string::~string((string *)&searchFn);
  return this_local._7_1_;
}

Assistant:

bool cmFindPackageCommand::SearchAppBundlePrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in.back() == '/');

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string const prefix = prefix_in.substr(0, prefix_in.size() - 1);

  auto searchFn = [this](const std::string& fullPath) -> bool {
    return this->SearchDirectory(fullPath);
  };

  auto appGen = cmMacProjectDirectoryListGenerator{ this->Names, ".app"_s };
  auto crGen = cmAppendPathSegmentGenerator{ "Contents/Resources"_s };

  // <prefix>/Foo.app/Contents/Resources
  if (TryGeneratedPaths(searchFn, prefix, appGen, crGen)) {
    return true;
  }

  // <prefix>/Foo.app/Contents/Resources/CMake
  return TryGeneratedPaths(
    searchFn, prefix, appGen, crGen,
    cmCaseInsensitiveDirectoryListGenerator{ "cmake"_s });
}